

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_geometry.cpp
# Opt level: O0

Type Internal_ON_ModelGeometry_TypeFilter(Type type)

{
  Type type_local;
  
  switch(type) {
  case Unset:
    return type;
  case Image:
    break;
  case TextureMapping:
    break;
  case Material:
    break;
  case LinePattern:
    break;
  case Layer:
    break;
  case Group:
    break;
  case TextStyle:
    break;
  case DimStyle:
    break;
  case RenderLight:
    return type;
  case HatchPattern:
    break;
  case InstanceDefinition:
    break;
  case ModelGeometry:
    return type;
  case HistoryRecord:
    break;
  case Mixed:
    break;
  default:
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_geometry.cpp"
             ,0x75,"","Invalid ON_ModelComponent::Type for ON_ModelGeometryComponent.");
  return Unset;
}

Assistant:

static ON_ModelComponent::Type Internal_ON_ModelGeometry_TypeFilter(ON_ModelComponent::Type type)
{
  switch (type)
  {
  case ON_ModelComponent::Type::Unset:
    return type;
    break;
  case ON_ModelComponent::Type::Image:
    break;
  case ON_ModelComponent::Type::TextureMapping:
    break;
  case ON_ModelComponent::Type::RenderMaterial:
    break;
  case ON_ModelComponent::Type::LinePattern:
    break;
  case ON_ModelComponent::Type::Layer:
    break;
  case ON_ModelComponent::Type::Group:
    break;
  case ON_ModelComponent::Type::TextStyle:
    break;
  case ON_ModelComponent::Type::DimStyle:
    break;
  case ON_ModelComponent::Type::RenderLight:
    return type;
    break;
  case ON_ModelComponent::Type::HatchPattern:
    break;
  case ON_ModelComponent::Type::InstanceDefinition:
    break;
  case ON_ModelComponent::Type::ModelGeometry:
    return type;
    break;
  case ON_ModelComponent::Type::HistoryRecord:
    break;
  case ON_ModelComponent::Type::Mixed:
    break;
  default:
    break;
  }

  ON_ERROR("Invalid ON_ModelComponent::Type for ON_ModelGeometryComponent.");
  return ON_ModelComponent::Type::Unset;
}